

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementShellANCF_3423::Calc_detJ0
          (ChElementShellANCF_3423 *this,double x,double y,double z,ShapeVector *Nx,ShapeVector *Ny,
          ShapeVector *Nz,ChMatrixNM<double,_1,_3> *Nx_d0,ChMatrixNM<double,_1,_3> *Ny_d0,
          ChMatrixNM<double,_1,_3> *Nz_d0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  dVar18 = y;
  ShapeFunctionsDerivativeX(this,Nx,x,y,z);
  ShapeFunctionsDerivativeY(this,Ny,x,dVar18,z);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[0] = 0.0
  ;
  dVar18 = (1.0 - x) * 0.25;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[1] =
       dVar18 * (1.0 - y);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[2] = 0.0
  ;
  dVar15 = (x + 1.0) * 0.25;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[3] =
       dVar15 * (1.0 - y);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] = 0.0
  ;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar15 * (y + 1.0);
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] = 0.0
  ;
  (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar18 * (y + 1.0);
  dVar18 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  auVar19._0_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[0];
  auVar19._8_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[1];
  dVar15 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  auVar23._8_8_ = dVar15;
  auVar23._0_8_ = dVar15;
  auVar16 = vfmadd231pd_fma(auVar19,auVar23,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar1 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar27._8_8_ = dVar1;
  auVar27._0_8_ = dVar1;
  auVar16 = vfmadd231pd_fma(auVar16,auVar27,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar2 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar31._8_8_ = dVar2;
  auVar31._0_8_ = dVar2;
  auVar16 = vfmadd231pd_fma(auVar16,auVar31,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar3 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar34._8_8_ = dVar3;
  auVar34._0_8_ = dVar3;
  auVar16 = vfmadd231pd_fma(auVar16,auVar34,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar4 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar40._8_8_ = dVar4;
  auVar40._0_8_ = dVar4;
  auVar16 = vfmadd231pd_fma(auVar16,auVar40,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar5 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar44._8_8_ = dVar5;
  auVar44._0_8_ = dVar5;
  auVar16 = vfmadd231pd_fma(auVar16,auVar44,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar6 = (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar47._8_8_ = dVar6;
  auVar47._0_8_ = dVar6;
  auVar16 = vfmadd231pd_fma(auVar16,auVar47,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[2];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  dVar9 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  dVar10 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xb];
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x11];
  dVar13 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  *(undefined1 (*) [16])
   (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar16;
  (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar18 * dVar7 + dVar15 * dVar8 + dVar1 * dVar9 + dVar2 * dVar10 +
       dVar3 * dVar11 + dVar4 * dVar12 + dVar5 * dVar13 + dVar6 * dVar14;
  dVar18 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  auVar20._0_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[0];
  auVar20._8_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[1];
  dVar15 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  auVar24._8_8_ = dVar15;
  auVar24._0_8_ = dVar15;
  auVar16 = vfmadd231pd_fma(auVar20,auVar24,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar1 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar28._8_8_ = dVar1;
  auVar28._0_8_ = dVar1;
  auVar16 = vfmadd231pd_fma(auVar16,auVar28,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar2 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar32._8_8_ = dVar2;
  auVar32._0_8_ = dVar2;
  auVar16 = vfmadd231pd_fma(auVar16,auVar32,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar3 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar35._8_8_ = dVar3;
  auVar35._0_8_ = dVar3;
  auVar16 = vfmadd231pd_fma(auVar16,auVar35,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar4 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar41._8_8_ = dVar4;
  auVar41._0_8_ = dVar4;
  auVar16 = vfmadd231pd_fma(auVar16,auVar41,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar5 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar45._8_8_ = dVar5;
  auVar45._0_8_ = dVar5;
  auVar16 = vfmadd231pd_fma(auVar16,auVar45,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar6 = (Ny->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar48._8_8_ = dVar6;
  auVar48._0_8_ = dVar6;
  auVar16 = vfmadd231pd_fma(auVar16,auVar48,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[2];
  dVar8 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[5];
  dVar9 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  dVar10 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xb];
  dVar11 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0xe];
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x11];
  dVar13 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x14];
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[0x17];
  *(undefined1 (*) [16])
   (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar16;
  (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar18 * dVar7 + dVar15 * dVar8 + dVar1 * dVar9 + dVar2 * dVar10 +
       dVar3 * dVar11 + dVar4 * dVar12 + dVar5 * dVar13 + dVar6 * dVar14;
  dVar18 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [0];
  auVar21._0_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[0];
  auVar21._8_8_ =
       dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[1];
  dVar15 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
           [1];
  auVar25._8_8_ = dVar15;
  auVar25._0_8_ = dVar15;
  auVar16 = vfmadd231pd_fma(auVar21,auVar25,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 3));
  dVar1 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [2];
  auVar29._8_8_ = dVar1;
  auVar29._0_8_ = dVar1;
  auVar16 = vfmadd231pd_fma(auVar16,auVar29,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 6));
  dVar2 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [3];
  auVar33._8_8_ = dVar2;
  auVar33._0_8_ = dVar2;
  auVar16 = vfmadd231pd_fma(auVar16,auVar33,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 9));
  dVar3 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [4];
  auVar36._8_8_ = dVar3;
  auVar36._0_8_ = dVar3;
  auVar16 = vfmadd231pd_fma(auVar16,auVar36,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xc));
  dVar4 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [5];
  auVar42._8_8_ = dVar4;
  auVar42._0_8_ = dVar4;
  auVar16 = vfmadd231pd_fma(auVar16,auVar42,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0xf));
  dVar5 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [6];
  auVar46._8_8_ = dVar5;
  auVar46._0_8_ = dVar5;
  auVar16 = vfmadd231pd_fma(auVar16,auVar46,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x12));
  dVar6 = (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array
          [7];
  auVar49._8_8_ = dVar6;
  auVar49._0_8_ = dVar6;
  auVar16 = vfmadd231pd_fma(auVar16,auVar49,
                            *(undefined1 (*) [16])
                             ((this->m_d0).
                              super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage
                              .m_data.array + 0x15));
  dVar6 = dVar18 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array[2] +
          dVar15 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                   m_storage.m_data.array[5] +
          dVar1 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[8] +
          dVar2 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[0xb] +
          dVar3 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[0xe] +
          dVar4 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[0x11] +
          dVar5 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[0x14] +
          dVar6 * (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.
                  m_storage.m_data.array[0x17];
  *(undefined1 (*) [16])
   (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array =
       auVar16;
  (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[2] =
       dVar6;
  dVar18 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar18;
  dVar15 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[1];
  dVar1 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1;
  dVar2 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar3 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3;
  dVar4 = (Nz_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1];
  dVar5 = (Nx_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar6;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 * dVar15;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar18 * dVar4 * dVar5;
  auVar16 = vfmadd231sd_fma(auVar50,auVar16,auVar37);
  dVar18 = (Ny_d0->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar18;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar3 * dVar2;
  auVar16 = vfmadd213sd_fma(auVar38,auVar51,auVar16);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar5 * dVar15;
  auVar16 = vfnmadd213sd_fma(auVar26,auVar43,auVar16);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar18 * dVar4;
  auVar16 = vfnmadd213sd_fma(auVar39,auVar30,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2 * dVar6;
  auVar16 = vfnmadd213sd_fma(auVar17,auVar22,auVar16);
  return auVar16._0_8_;
}

Assistant:

double ChElementShellANCF_3423::Calc_detJ0(double x,
                                           double y,
                                           double z,
                                           ShapeVector& Nx,
                                           ShapeVector& Ny,
                                           ShapeVector& Nz,
                                           ChMatrixNM<double, 1, 3>& Nx_d0,
                                           ChMatrixNM<double, 1, 3>& Ny_d0,
                                           ChMatrixNM<double, 1, 3>& Nz_d0) {
    ShapeFunctionsDerivativeX(Nx, x, y, z);
    ShapeFunctionsDerivativeY(Ny, x, y, z);
    ShapeFunctionsDerivativeZ(Nz, x, y, z);

    Nx_d0 = Nx * m_d0;
    Ny_d0 = Ny * m_d0;
    Nz_d0 = Nz * m_d0;

    double detJ0 = Nx_d0(0, 0) * Ny_d0(0, 1) * Nz_d0(0, 2) + Ny_d0(0, 0) * Nz_d0(0, 1) * Nx_d0(0, 2) +
                   Nz_d0(0, 0) * Nx_d0(0, 1) * Ny_d0(0, 2) - Nx_d0(0, 2) * Ny_d0(0, 1) * Nz_d0(0, 0) -
                   Ny_d0(0, 2) * Nz_d0(0, 1) * Nx_d0(0, 0) - Nz_d0(0, 2) * Nx_d0(0, 1) * Ny_d0(0, 0);

    return detJ0;
}